

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::clear(raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->size_ != 0) {
    if (this->capacity_ != 0) {
      sVar1 = this->capacity_;
      if (sVar1 != 0) {
        sVar2 = 0;
        do {
          if (-1 < this->ctrl_[sVar2]) {
            NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>::
            delete_element<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
                      ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
                       &this->settings_,this->slots_[sVar2]);
          }
          sVar2 = sVar2 + 1;
          sVar1 = this->capacity_;
        } while (sVar2 != sVar1);
      }
      this->size_ = 0;
      memset(this->ctrl_,0x80,sVar1 + 0x10);
      this->ctrl_[sVar1] = -1;
      reset_growth_left(this,this->capacity_);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x50a,
                    "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>>::clear() [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }